

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<8,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  float *pfVar2;
  Vector<float,_3> *pVVar3;
  Vec4 *pVVar4;
  long lVar5;
  undefined4 *puVar6;
  long lVar7;
  Vector<float,_3> *pVVar8;
  int col;
  long lVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  float afStack_54 [5];
  int aiStack_40 [6];
  Type in0;
  long lVar11;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&in0;
    lVar5 = 0;
    lVar7 = 0;
    do {
      lVar9 = 0;
      auVar10 = _DAT_019f34d0;
      do {
        bVar12 = SUB164(auVar10 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar5 != lVar9) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)pfVar2 + lVar9) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar5 + -0xc != lVar9) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)pfVar2 + lVar9 + 0xc) = uVar13;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar9 = lVar9 + 0x18;
      } while (lVar9 != 0x30);
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + 0xc;
      pfVar2 = pfVar2 + 1;
    } while (lVar7 != 3);
    pVVar4 = evalCtx->in;
    in0.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    in0.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    in0.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
    in0.m_data.m_data[2].m_data[0] = evalCtx->in[2].m_data[0];
    in0.m_data.m_data[2].m_data[1] = evalCtx->in[2].m_data[1];
    in0.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar3 = (Vector<float,_3> *)&in0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[2] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[2] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[2] = 0.0;
    puVar6 = &s_constInMat3x3;
    lVar5 = 0;
    do {
      lVar7 = 0;
      pVVar8 = pVVar3;
      do {
        ((Vector<tcu::Vector<float,_3>,_3> *)pVVar8->m_data)->m_data[0].m_data[0] =
             (float)puVar6[lVar7];
        lVar7 = lVar7 + 1;
        pVVar8 = pVVar8 + 1;
      } while (lVar7 != 3);
      lVar5 = lVar5 + 1;
      pVVar3 = (Vector<float,_3> *)(pVVar3->m_data + 1);
      puVar6 = puVar6 + 3;
    } while (lVar5 != 3);
    pVVar4 = (Vec4 *)&in0;
  }
  fVar1 = ((Vector<tcu::Vector<float,_3>,_3> *)pVVar4->m_data)->m_data[0].m_data[0];
  afStack_54[2] =
       (((in0.m_data.m_data[2].m_data[0] * in0.m_data.m_data[0].m_data[1] *
          in0.m_data.m_data[1].m_data[2] +
         fVar1 * in0.m_data.m_data[1].m_data[1] * in0.m_data.m_data[2].m_data[2] +
         in0.m_data.m_data[1].m_data[0] * in0.m_data.m_data[2].m_data[1] *
         in0.m_data.m_data[0].m_data[2]) -
        in0.m_data.m_data[2].m_data[1] * fVar1 * in0.m_data.m_data[1].m_data[2]) -
       in0.m_data.m_data[0].m_data[1] * in0.m_data.m_data[1].m_data[0] *
       in0.m_data.m_data[2].m_data[2]) -
       in0.m_data.m_data[1].m_data[1] * in0.m_data.m_data[2].m_data[0] *
       in0.m_data.m_data[0].m_data[2];
  afStack_54[3] = afStack_54[2];
  afStack_54[4] = afStack_54[2];
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar5]] = afStack_54[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = Vec3(determinant(in0));
	}